

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase434::run(TestCase434 *this)

{
  PromiseNode *pPVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  TransformPromiseNodeBase *this_00;
  char *pcVar5;
  nfds_t __nfds;
  nfds_t __nfds_00;
  pollfd *ppVar6;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar7;
  bool writable;
  Fault f_1;
  AutoCloseFd outfd;
  Fault f_2;
  AutoCloseFd infd;
  int pipefds [2];
  EventLoop loop;
  FdObserver observer;
  UnixEventPort port;
  char buffer [4096];
  char local_11d9;
  Own<kj::_::PromiseNode> local_11d8;
  AutoCloseFd local_11c0;
  undefined1 local_11b8 [8];
  PromiseNode *local_11b0;
  AutoCloseFd local_11a8;
  int local_11a0;
  int local_119c;
  EventLoop local_1198;
  FdObserver local_1160;
  UnixEventPort local_1108;
  undefined8 *local_1028;
  long *plStack_1020;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_1108);
  EventLoop::EventLoop(&local_1198,&local_1108.super_EventPort);
  EventLoop::enterScope(&local_1198);
  do {
    iVar2 = ::pipe(&local_11a0);
    if (-1 < iVar2) goto LAB_001dd74b;
    iVar2 = _::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_1160.eventPort = (UnixEventPort *)0x0;
    local_1028 = (undefined8 *)0x0;
    plStack_1020 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_1160,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_1160);
  }
LAB_001dd74b:
  local_11a8.fd = local_11a0;
  UnwindDetector::UnwindDetector(&local_11a8.unwindDetector);
  local_11c0.fd = local_119c;
  UnwindDetector::UnwindDetector(&local_11c0.unwindDetector);
  setNonblocking(local_11c0.fd);
  setNonblocking(local_11a8.fd);
  pcVar5 = (char *)0x2;
  UnixEventPort::FdObserver::FdObserver(&local_1160,&local_1108,local_11c0.fd,2);
  do {
    do {
      sVar4 = ::write(local_11c0.fd,"foo",3);
    } while (-1 < sVar4);
    iVar2 = _::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_11d8.disposer = (Disposer *)0x0;
    local_1028 = (undefined8 *)0x0;
    plStack_1020 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_11d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_11d8);
  }
  local_11d9 = '\0';
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_11b8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_11b8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:456:13),_kj::_::PropagateException>
             ::anon_class_8_1_79db791e_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00438268;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_11d9;
  local_11d8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase434::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_11d8.ptr = (PromiseNode *)this_00;
  OVar7 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_1028,&local_11d8);
  pPVar1 = local_11d8.ptr;
  if ((TransformPromiseNodeBase *)local_11d8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_11d8.ptr = (PromiseNode *)0x0;
    (**(local_11d8.disposer)->_vptr_Disposer)
              (local_11d8.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar7.ptr);
  }
  pPVar1 = local_11b0;
  if (local_11b0 != (PromiseNode *)0x0) {
    local_11b0 = (PromiseNode *)0x0;
    (**(_func_int **)(((String *)local_11b8)->content).ptr)
              (local_11b8,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  ppVar6 = (pollfd *)0xffffffff;
  EventLoop::run(&local_1198,0xffffffff);
  UnixEventPort::poll(&local_1108,ppVar6,__nfds,(int)pcVar5);
  EventLoop::run(&local_1198,0xffffffff);
  if ((local_11d9 == '\x01') && (_::Debug::minSeverity < 3)) {
    pcVar5 = "\"failed: expected \" \"!(writable)\"";
    _::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1ce,ERROR,"\"failed: expected \" \"!(writable)\"",
               (char (*) [29])"failed: expected !(writable)");
  }
  do {
    while( true ) {
      sVar4 = read(local_11a8.fd,&local_1028,0x1000);
      iVar2 = (int)pcVar5;
      if (sVar4 < 0) break;
      if (sVar4 == 0) {
LAB_001dd931:
        ppVar6 = (pollfd *)0xffffffff;
        EventLoop::run(&local_1198,0xffffffff);
        UnixEventPort::poll(&local_1108,ppVar6,__nfds_00,iVar2);
        EventLoop::run(&local_1198,0xffffffff);
        if ((local_11d9 == '\0') && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[26]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                     ,0x1dd,ERROR,"\"failed: expected \" \"writable\"",
                     (char (*) [26])"failed: expected writable");
        }
        if (plStack_1020 != (long *)0x0) {
          (**(code **)*local_1028)(local_1028,(long)plStack_1020 + *(long *)(*plStack_1020 + -0x10))
          ;
        }
        UnixEventPort::FdObserver::~FdObserver(&local_1160);
        AutoCloseFd::~AutoCloseFd(&local_11c0);
        AutoCloseFd::~AutoCloseFd(&local_11a8);
        EventLoop::leaveScope(&local_1198);
        EventLoop::~EventLoop(&local_1198);
        UnixEventPort::~UnixEventPort(&local_1108);
        return;
      }
    }
    iVar3 = _::Debug::getOsErrorNumber(true);
    iVar2 = (int)pcVar5;
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_11b8 = (undefined1  [8])0x0;
    local_11d8.disposer = (Disposer *)0x0;
    local_11d8.ptr = (PromiseNode *)0x0;
    _::Debug::Fault::init
              ((Fault *)local_11b8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)local_11b8);
  }
  goto LAB_001dd931;
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  kj::AutoCloseFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096];
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}